

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::InterpretArgument
          (CommandLineInterface *this,string *name,string *value)

{
  _Rb_tree_header *p_Var1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 uVar2;
  int iVar3;
  iterator iVar4;
  long lVar5;
  mapped_type *pmVar6;
  int version;
  long lVar7;
  size_type sVar8;
  ostream *poVar9;
  char *pcVar10;
  pointer pcVar11;
  char cVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__return_storage_ptr__;
  ulong uVar13;
  string *psVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  bool bVar16;
  string path;
  string disk_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string plugin_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  undefined1 local_a8 [40];
  _Alloc_hider local_80;
  undefined1 local_78 [24];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  CommandLineInterface *local_38;
  
  if (name->_M_string_length == 0) {
    if (value->_M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->input_files_,value);
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "You seem to have passed an empty string as one of the arguments to ",0x43);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->executable_name_)._M_dataplus._M_p,
                        (this->executable_name_)._M_string_length);
    pcVar10 = 
    ".  This is actually sort of hard to do.  Congrats.  Unfortunately it is not valid input so the program is going to die now."
    ;
    lVar7 = 0x7b;
LAB_0022ae6d:
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,lVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    return PARSE_ARGUMENT_FAIL;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 == 0)) {
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38 = this;
    SplitStringUsing(value,":",&local_c8);
    if (local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_38 = (CommandLineInterface *)&local_38->proto_path_;
      lVar7 = 0;
      uVar13 = 0;
      do {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        local_108._M_string_length = 0;
        local_108.field_2._M_local_buf[0] = '\0';
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_e8._M_string_length = 0;
        local_e8.field_2._M_local_buf[0] = '\0';
        lVar5 = std::__cxx11::string::find
                          ((char)local_c8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (char)lVar7,0x3d);
        if (lVar5 == -1) {
          std::__cxx11::string::_M_replace
                    ((ulong)&local_108,0,(char *)local_108._M_string_length,0x38f545);
          std::__cxx11::string::_M_assign((string *)&local_e8);
        }
        else {
          std::__cxx11::string::substr
                    ((ulong)local_a8,
                     (long)&((local_c8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7)
          ;
          std::__cxx11::string::operator=((string *)&local_108,(string *)local_a8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
             ) {
            operator_delete((void *)local_a8._0_8_);
          }
          std::__cxx11::string::substr
                    ((ulong)local_a8,
                     (long)&((local_c8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7)
          ;
          std::__cxx11::string::operator=((string *)&local_e8,(string *)local_a8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
             ) {
            operator_delete((void *)local_a8._0_8_);
          }
        }
        sVar8 = local_e8._M_string_length;
        if (local_e8._M_string_length == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "--proto_path passed empty directory name.  (Use \".\" for current directory.)"
                     ,0x4b);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
        }
        else {
          iVar3 = access(local_e8._M_dataplus._M_p,0);
          if (iVar3 < 0) {
            iVar3 = access(*(char **)((long)&((local_c8.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar7),0);
            if (iVar3 < 0) {
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_e8._M_dataplus._M_p,
                                  local_e8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,": warning: directory does not exist.",0x24);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
            }
            else {
              std::__cxx11::string::_M_replace
                        ((ulong)&local_108,0,(char *)local_108._M_string_length,0x38f545);
              std::__cxx11::string::_M_assign((string *)&local_e8);
            }
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_a8,&local_108,&local_e8);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)local_38,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_a8);
          if ((undefined1 *)local_a8._32_8_ != local_78) {
            operator_delete((void *)local_a8._32_8_);
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
             ) {
            operator_delete((void *)local_a8._0_8_);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        if (sVar8 == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_c8);
          return PARSE_ARGUMENT_FAIL;
        }
        uVar13 = uVar13 + 1;
        lVar7 = lVar7 + 0x20;
      } while (uVar13 < (ulong)((long)local_c8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_c8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    __return_storage_ptr__ = &local_c8;
LAB_0022adce:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 == 0) {
    if (this->direct_dependencies_explicitly_set_ == true) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
      pcVar10 = 
      " may only be passed once. To specify multiple direct dependencies, pass them all as a single parameter separated by \':\'."
      ;
      lVar7 = 0x78;
      goto LAB_0022ae6d;
    }
    this->direct_dependencies_explicitly_set_ = true;
    local_a8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_a8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_a8._16_8_ = 0;
    SplitStringUsing(value,":",
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_a8);
    uVar2 = local_a8._8_8_;
    this_00 = &this->direct_dependencies_;
    local_108._M_dataplus._M_p = (pointer)this_00;
    if (local_a8._0_8_ != local_a8._8_8_) {
      pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)this_00,
                   (const_iterator)&(this->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header,
                   pbVar15,(_Alloc_node *)&local_108);
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar2
              );
    }
    __return_storage_ptr__ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_a8;
    goto LAB_0022adce;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 == 0) {
    psVar14 = (string *)&this->direct_dependencies_violation_msg_;
    goto LAB_0022aea8;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 == 0) {
    if ((this->descriptor_set_in_names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->descriptor_set_in_names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (value->_M_string_length == 0) {
LAB_0022b07b:
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
        pcVar10 = " requires a non-empty value.";
        lVar7 = 0x1c;
      }
      else {
        if ((this->dependency_out_name_)._M_string_length == 0) {
          __return_storage_ptr__ =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8;
          Split(__return_storage_ptr__,value,":",true);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&this->descriptor_set_in_names_,__return_storage_ptr__);
          goto LAB_0022adce;
        }
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
        pcVar10 = " cannot be used with --dependency_out.";
        lVar7 = 0x26;
      }
    }
    else {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,
                 " may only be passed once. To specify multiple descriptor sets, pass them all as a single parameter separated by \'"
                 ,0x71);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
      pcVar10 = "\'.";
      lVar7 = 2;
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)name);
    if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 == 0)) {
      if ((this->descriptor_set_out_name_)._M_string_length != 0) goto LAB_0022af3a;
      if (value->_M_string_length == 0) goto LAB_0022b07b;
      if (this->mode_ == MODE_COMPILE) {
        psVar14 = (string *)&this->descriptor_set_out_name_;
        goto LAB_0022aea8;
      }
      poVar9 = (ostream *)&std::cerr;
      pcVar10 = "Cannot use --encode or --decode and generate descriptors at the same time.";
      lVar7 = 0x4a;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)name);
      if (iVar3 == 0) {
        if ((this->dependency_out_name_)._M_string_length == 0) {
          if (value->_M_string_length == 0) goto LAB_0022b07b;
          if ((this->descriptor_set_in_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (this->descriptor_set_in_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            psVar14 = (string *)&this->dependency_out_name_;
            goto LAB_0022aea8;
          }
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length)
          ;
          pcVar10 = " cannot be used with --descriptor_set_in.";
          lVar7 = 0x29;
          goto LAB_0022b0a0;
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)name);
        if (iVar3 == 0) {
          if (this->imports_in_descriptor_set_ != true) {
            this->imports_in_descriptor_set_ = true;
            return PARSE_ARGUMENT_DONE_AND_CONTINUE;
          }
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)name);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)name);
            if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 == 0)) {
              PrintHelpText(this);
              return PARSE_ARGUMENT_DONE_AND_EXIT;
            }
            iVar3 = std::__cxx11::string::compare((char *)name);
            if (iVar3 == 0) {
              sVar8 = (this->version_info_)._M_string_length;
              if (sVar8 != 0) {
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(this->version_info_)._M_dataplus._M_p,
                                    sVar8);
                std::endl<char,std::char_traits<char>>(poVar9);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"libprotoc ",10);
              internal::VersionString_abi_cxx11_((string *)local_a8,(internal *)0x2de9e9,version);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)local_a8._0_8_,local_a8._8_8_);
              std::endl<char,std::char_traits<char>>(poVar9);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_a8._0_8_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_a8 + 0x10)) {
                return PARSE_ARGUMENT_DONE_AND_EXIT;
              }
              operator_delete((void *)local_a8._0_8_);
              return PARSE_ARGUMENT_DONE_AND_EXIT;
            }
            iVar3 = std::__cxx11::string::compare((char *)name);
            if (iVar3 == 0) {
              this->disallow_services_ = true;
              return PARSE_ARGUMENT_DONE_AND_CONTINUE;
            }
            iVar3 = std::__cxx11::string::compare((char *)name);
            if (((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 != 0))
               && (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 != 0)) {
              iVar3 = std::__cxx11::string::compare((char *)name);
              if (iVar3 == 0) {
                iVar3 = std::__cxx11::string::compare((char *)value);
                if (iVar3 == 0) {
                  this->error_format_ = ERROR_FORMAT_GCC;
                  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                }
                iVar3 = std::__cxx11::string::compare((char *)value);
                if (iVar3 == 0) {
                  this->error_format_ = ERROR_FORMAT_MSVS;
                  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Unknown error format: ",0x16);
                pcVar11 = (value->_M_dataplus)._M_p;
                sVar8 = value->_M_string_length;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)name);
                cVar12 = (char)value;
                if (iVar3 == 0) {
                  if ((this->plugin_prefix_)._M_string_length != 0) {
                    local_a8._8_8_ = (pointer)0x0;
                    local_a8._16_8_ = local_a8._16_8_ & 0xffffffffffffff00;
                    local_108._M_string_length = 0;
                    local_108.field_2._M_local_buf[0] = '\0';
                    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                    local_a8._0_8_ = local_a8 + 0x10;
                    lVar7 = std::__cxx11::string::find(cVar12,0x3d);
                    if (lVar7 == -1) {
                      lVar7 = std::__cxx11::string::rfind(cVar12,0x2f);
                      if (lVar7 == -1) {
                        std::__cxx11::string::_M_assign((string *)local_a8);
                      }
                      else {
                        std::__cxx11::string::substr((ulong)&local_e8,(ulong)value);
                        std::__cxx11::string::operator=((string *)local_a8,(string *)&local_e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                          operator_delete(local_e8._M_dataplus._M_p);
                        }
                      }
                      std::__cxx11::string::_M_assign((string *)&local_108);
                    }
                    else {
                      std::__cxx11::string::substr((ulong)&local_e8,(ulong)value);
                      std::__cxx11::string::operator=((string *)local_a8,(string *)&local_e8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                        operator_delete(local_e8._M_dataplus._M_p);
                      }
                      std::__cxx11::string::substr((ulong)&local_e8,(ulong)value);
                      std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                        operator_delete(local_e8._M_dataplus._M_p);
                      }
                    }
                    pmVar6 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[](&this->plugins_,(key_type *)local_a8);
                    std::__cxx11::string::_M_assign((string *)pmVar6);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_108._M_dataplus._M_p != &local_108.field_2) {
                      operator_delete(local_108._M_dataplus._M_p);
                    }
                    if ((undefined1 *)local_a8._0_8_ == local_a8 + 0x10) {
                      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                    }
                    operator_delete((void *)local_a8._0_8_);
                    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                  }
                  pcVar10 = "This compiler does not support plugins.";
LAB_0022b5b0:
                  poVar9 = (ostream *)&std::cerr;
                  lVar7 = 0x27;
                  goto LAB_0022b0a0;
                }
                iVar3 = std::__cxx11::string::compare((char *)name);
                if (iVar3 == 0) {
                  if (this->mode_ == MODE_COMPILE) {
                    if (((this->output_directives_).
                         super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                         (this->output_directives_).
                         super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                         ._M_impl.super__Vector_impl_data._M_finish) &&
                       ((this->descriptor_set_out_name_)._M_string_length == 0)) {
                      this->mode_ = MODE_PRINT;
                      this->print_mode_ = PRINT_FREE_FIELDS;
                      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                    }
                    goto LAB_0022b6bd;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Cannot use ",0xb);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,
                                      name->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9," and use --encode, --decode or print ",0x25);
                  pcVar10 = "other info at the same time.";
                  lVar7 = 0x1c;
                  goto LAB_0022b0a0;
                }
                iVar4 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>
                        ::find(&(this->generators_by_flag_name_)._M_t,name);
                p_Var1 = &(this->generators_by_flag_name_)._M_t._M_impl.super__Rb_tree_header;
                if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
LAB_0022aacd:
                  if (this->mode_ == MODE_COMPILE) {
                    local_a8._0_8_ = local_a8 + 0x10;
                    local_a8._8_8_ = (pointer)0x0;
                    local_a8._16_8_ = local_a8._16_8_ & 0xffffffffffffff00;
                    local_80._M_p = local_78 + 8;
                    local_78._0_8_ = 0;
                    local_78[8] = '\0';
                    local_60._M_p = (pointer)&local_50;
                    local_58 = 0;
                    local_50._M_local_buf[0] = '\0';
                    std::__cxx11::string::_M_assign((string *)local_a8);
                    if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
                      local_a8._32_8_ = (pointer)0x0;
                    }
                    else {
                      local_a8._32_8_ = *(undefined8 *)(iVar4._M_node + 4);
                    }
                    lVar7 = std::__cxx11::string::find(cVar12,0x3a);
                    if (lVar7 == -1) {
                      std::__cxx11::string::_M_assign((string *)&local_60);
                    }
                    else {
                      std::__cxx11::string::substr((ulong)&local_108,(ulong)value);
                      std::__cxx11::string::operator=((string *)&local_80,(string *)&local_108);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108._M_dataplus._M_p != &local_108.field_2) {
                        operator_delete(local_108._M_dataplus._M_p);
                      }
                      std::__cxx11::string::substr((ulong)&local_108,(ulong)value);
                      std::__cxx11::string::operator=((string *)&local_60,(string *)&local_108);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108._M_dataplus._M_p != &local_108.field_2) {
                        operator_delete(local_108._M_dataplus._M_p);
                      }
                    }
                    std::
                    vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                    ::push_back(&this->output_directives_,(value_type *)local_a8);
                    OutputDirective::~OutputDirective((OutputDirective *)local_a8);
                    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                  }
                  poVar9 = (ostream *)&std::cerr;
                  pcVar10 = 
                  "Cannot use --encode, --decode or print .proto info and generate code at the same time."
                  ;
                  lVar7 = 0x56;
                  goto LAB_0022b0a0;
                }
                if ((this->plugin_prefix_)._M_string_length != 0) {
                  local_a8._0_8_ = local_a8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"_out","");
                  bVar16 = true;
                  if ((ulong)local_a8._8_8_ <=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      name->_M_string_length) {
                    iVar3 = std::__cxx11::string::compare
                                      ((ulong)name,(long)name->_M_string_length - local_a8._8_8_,
                                       (string *)local_a8._8_8_);
                    bVar16 = iVar3 != 0;
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_a8._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_a8 + 0x10)) {
                    operator_delete((void *)local_a8._0_8_);
                  }
                  if (!bVar16) goto LAB_0022aacd;
                }
                iVar4 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>
                        ::find(&(this->generators_by_option_name_)._M_t,name);
                if ((_Rb_tree_header *)iVar4._M_node !=
                    &(this->generators_by_option_name_)._M_t._M_impl.super__Rb_tree_header) {
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](&this->generator_parameters_,(key_type *)(iVar4._M_node + 2)
                                       );
                  sVar8 = pmVar6->_M_string_length;
joined_r0x0022b861:
                  if (sVar8 != 0) {
                    std::__cxx11::string::append((char *)pmVar6);
                  }
                  std::__cxx11::string::_M_append((char *)pmVar6,(ulong)(value->_M_dataplus)._M_p);
                  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                }
                pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a8 + 0x10);
                local_a8._0_8_ = pbVar15;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"--","");
                if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     name->_M_string_length < (ulong)local_a8._8_8_) ||
                   (iVar3 = std::__cxx11::string::compare((ulong)name,0,(string *)local_a8._8_8_),
                   iVar3 != 0)) {
                  bVar16 = false;
                }
                else {
                  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"_opt","");
                  if ((string *)name->_M_string_length < local_108._M_string_length) {
                    bVar16 = false;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare
                                      ((ulong)name,
                                       (long)name->_M_string_length - local_108._M_string_length,
                                       (string *)local_108._M_string_length);
                    bVar16 = iVar3 == 0;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._M_dataplus._M_p != &local_108.field_2) {
                    operator_delete(local_108._M_dataplus._M_p);
                  }
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_a8._0_8_ != pbVar15) {
                  operator_delete((void *)local_a8._0_8_);
                }
                if (bVar16) {
                  anon_unknown_4::PluginName
                            ((string *)local_a8,
                             (anon_unknown_4 *)(this->plugin_prefix_)._M_dataplus._M_p,
                             (string *)(this->plugin_prefix_)._M_string_length,name);
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](&this->plugin_parameters_,(string *)local_a8);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_a8._0_8_ != pbVar15) {
                    operator_delete((void *)local_a8._0_8_);
                  }
                  sVar8 = pmVar6->_M_string_length;
                  goto joined_r0x0022b861;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Unknown flag: ",0xe);
                pcVar11 = (name->_M_dataplus)._M_p;
                sVar8 = name->_M_string_length;
              }
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,pcVar11,sVar8);
              goto LAB_0022b0a8;
            }
            if (this->mode_ == MODE_COMPILE) {
              if (((this->output_directives_).
                   super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                   ._M_impl.super__Vector_impl_data._M_start ==
                   (this->output_directives_).
                   super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
                 ((this->descriptor_set_out_name_)._M_string_length == 0)) {
                iVar3 = std::__cxx11::string::compare((char *)name);
                this->mode_ = MODE_DECODE - (iVar3 == 0);
                if (value->_M_string_length == 0) {
                  iVar3 = std::__cxx11::string::compare((char *)name);
                  if (iVar3 != 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Type name for ",0xe);
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,
                                        name->_M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar9," cannot be blank.",0x11);
                    std::endl<char,std::char_traits<char>>(poVar9);
                    iVar3 = std::__cxx11::string::compare((char *)name);
                    if (iVar3 == 0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "To decode an unknown message, use --decode_raw.",0x2f);
                      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                      return PARSE_ARGUMENT_FAIL;
                    }
                    return PARSE_ARGUMENT_FAIL;
                  }
                  if (value->_M_string_length != 0) goto LAB_0022b257;
                }
                else {
LAB_0022b257:
                  iVar3 = std::__cxx11::string::compare((char *)name);
                  if (iVar3 == 0) {
                    pcVar10 = "--decode_raw does not take a parameter.";
                    goto LAB_0022b5b0;
                  }
                }
                psVar14 = (string *)&this->codec_type_;
LAB_0022aea8:
                std::__cxx11::string::_M_assign(psVar14);
                return PARSE_ARGUMENT_DONE_AND_CONTINUE;
              }
LAB_0022b6bd:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Cannot use ",0xb);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,
                                  name->_M_string_length);
              pcVar10 = " and generate code or descriptors at the same time.";
              lVar7 = 0x33;
            }
            else {
              poVar9 = (ostream *)&std::cerr;
              pcVar10 = "Only one of --encode and --decode can be specified.";
              lVar7 = 0x33;
            }
            goto LAB_0022b0a0;
          }
          if (this->source_info_in_descriptor_set_ != true) {
            this->source_info_in_descriptor_set_ = true;
            return PARSE_ARGUMENT_DONE_AND_CONTINUE;
          }
        }
      }
LAB_0022af3a:
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
      pcVar10 = " may only be passed once.";
      lVar7 = 0x19;
    }
  }
LAB_0022b0a0:
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,lVar7);
LAB_0022b0a8:
  std::endl<char,std::char_traits<char>>(poVar9);
  return PARSE_ARGUMENT_FAIL;
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::InterpretArgument(const std::string& name,
                                        const std::string& value) {
  if (name.empty()) {
    // Not a flag.  Just a filename.
    if (value.empty()) {
      std::cerr
          << "You seem to have passed an empty string as one of the "
             "arguments to "
          << executable_name_
          << ".  This is actually "
             "sort of hard to do.  Congrats.  Unfortunately it is not valid "
             "input so the program is going to die now."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

#if defined(_WIN32)
    // On Windows, the shell (typically cmd.exe) does not expand wildcards in
    // file names (e.g. foo\*.proto), so we do it ourselves.
    switch (google::protobuf::io::win32::ExpandWildcards(
        value,
        [this](const string& path) { this->input_files_.push_back(path); })) {
      case google::protobuf::io::win32::ExpandWildcardsResult::kSuccess:
        break;
      case google::protobuf::io::win32::ExpandWildcardsResult::
          kErrorNoMatchingFile:
        // Path does not exist, is not a file, or it's longer than MAX_PATH and
        // long path handling is disabled.
        std::cerr << "Invalid file name pattern or missing input file \""
                  << value << "\"" << std::endl;
        return PARSE_ARGUMENT_FAIL;
      default:
        std::cerr << "Cannot convert path \"" << value
                  << "\" to or from Windows style" << std::endl;
        return PARSE_ARGUMENT_FAIL;
    }
#else   // not _WIN32
    // On other platforms than Windows (e.g. Linux, Mac OS) the shell (typically
    // Bash) expands wildcards.
    input_files_.push_back(value);
#endif  // _WIN32

  } else if (name == "-I" || name == "--proto_path") {
    // Java's -classpath (and some other languages) delimits path components
    // with colons.  Let's accept that syntax too just to make things more
    // intuitive.
    std::vector<std::string> parts = Split(
        value, CommandLineInterface::kPathSeparator,
        true);

    for (int i = 0; i < parts.size(); i++) {
      std::string virtual_path;
      std::string disk_path;

      std::string::size_type equals_pos = parts[i].find_first_of('=');
      if (equals_pos == std::string::npos) {
        virtual_path = "";
        disk_path = parts[i];
      } else {
        virtual_path = parts[i].substr(0, equals_pos);
        disk_path = parts[i].substr(equals_pos + 1);
      }

      if (disk_path.empty()) {
        std::cerr
            << "--proto_path passed empty directory name.  (Use \".\" for "
               "current directory.)"
            << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      // Make sure disk path exists, warn otherwise.
      if (access(disk_path.c_str(), F_OK) < 0) {
        // Try the original path; it may have just happened to have a '=' in it.
        if (access(parts[i].c_str(), F_OK) < 0) {
          std::cerr << disk_path << ": warning: directory does not exist."
                    << std::endl;
        } else {
          virtual_path = "";
          disk_path = parts[i];
        }
      }

      // Don't use make_pair as the old/default standard library on Solaris
      // doesn't support it without explicit template parameters, which are
      // incompatible with C++0x's make_pair.
      proto_path_.push_back(
          std::pair<std::string, std::string>(virtual_path, disk_path));
    }

  } else if (name == "--direct_dependencies") {
    if (direct_dependencies_explicitly_set_) {
      std::cerr << name
                << " may only be passed once. To specify multiple "
                   "direct dependencies, pass them all as a single "
                   "parameter separated by ':'."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    direct_dependencies_explicitly_set_ = true;
    std::vector<std::string> direct =
        Split(value, ":", true);
    GOOGLE_DCHECK(direct_dependencies_.empty());
    direct_dependencies_.insert(direct.begin(), direct.end());

  } else if (name == "--direct_dependencies_violation_msg") {
    direct_dependencies_violation_msg_ = value;

  } else if (name == "--descriptor_set_in") {
    if (!descriptor_set_in_names_.empty()) {
      std::cerr << name
                << " may only be passed once. To specify multiple "
                   "descriptor sets, pass them all as a single "
                   "parameter separated by '"
                << CommandLineInterface::kPathSeparator << "'." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " cannot be used with --dependency_out."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    descriptor_set_in_names_ = Split(
        value, CommandLineInterface::kPathSeparator,
        true);

  } else if (name == "-o" || name == "--descriptor_set_out") {
    if (!descriptor_set_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (mode_ != MODE_COMPILE) {
      std::cerr
          << "Cannot use --encode or --decode and generate descriptors at the "
             "same time."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    descriptor_set_out_name_ = value;

  } else if (name == "--dependency_out") {
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!descriptor_set_in_names_.empty()) {
      std::cerr << name << " cannot be used with --descriptor_set_in."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    dependency_out_name_ = value;

  } else if (name == "--include_imports") {
    if (imports_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    imports_in_descriptor_set_ = true;

  } else if (name == "--include_source_info") {
    if (source_info_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    source_info_in_descriptor_set_ = true;

  } else if (name == "-h" || name == "--help") {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--version") {
    if (!version_info_.empty()) {
      std::cout << version_info_ << std::endl;
    }
    std::cout << "libprotoc " << internal::VersionString(PROTOBUF_VERSION)
              << std::endl;
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--disallow_services") {
    disallow_services_ = true;

  } else if (name == "--encode" || name == "--decode" ||
             name == "--decode_raw") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Only one of --encode and --decode can be specified."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_out_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    mode_ = (name == "--encode") ? MODE_ENCODE : MODE_DECODE;

    if (value.empty() && name != "--decode_raw") {
      std::cerr << "Type name for " << name << " cannot be blank." << std::endl;
      if (name == "--decode") {
        std::cerr << "To decode an unknown message, use --decode_raw."
                  << std::endl;
      }
      return PARSE_ARGUMENT_FAIL;
    } else if (!value.empty() && name == "--decode_raw") {
      std::cerr << "--decode_raw does not take a parameter." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    codec_type_ = value;

  } else if (name == "--error_format") {
    if (value == "gcc") {
      error_format_ = ERROR_FORMAT_GCC;
    } else if (value == "msvs") {
      error_format_ = ERROR_FORMAT_MSVS;
    } else {
      std::cerr << "Unknown error format: " << value << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

  } else if (name == "--plugin") {
    if (plugin_prefix_.empty()) {
      std::cerr << "This compiler does not support plugins." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    std::string plugin_name;
    std::string path;

    std::string::size_type equals_pos = value.find_first_of('=');
    if (equals_pos == std::string::npos) {
      // Use the basename of the file.
      std::string::size_type slash_pos = value.find_last_of('/');
      if (slash_pos == std::string::npos) {
        plugin_name = value;
      } else {
        plugin_name = value.substr(slash_pos + 1);
      }
      path = value;
    } else {
      plugin_name = value.substr(0, equals_pos);
      path = value.substr(equals_pos + 1);
    }

    plugins_[plugin_name] = path;

  } else if (name == "--print_free_field_numbers") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Cannot use " << name
                << " and use --encode, --decode or print "
                << "other info at the same time." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_out_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    mode_ = MODE_PRINT;
    print_mode_ = PRINT_FREE_FIELDS;
  } else {
    // Some other flag.  Look it up in the generators list.
    const GeneratorInfo* generator_info =
        FindOrNull(generators_by_flag_name_, name);
    if (generator_info == NULL &&
        (plugin_prefix_.empty() || !HasSuffixString(name, "_out"))) {
      // Check if it's a generator option flag.
      generator_info = FindOrNull(generators_by_option_name_, name);
      if (generator_info != NULL) {
        std::string* parameters =
            &generator_parameters_[generator_info->flag_name];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else if (HasPrefixString(name, "--") && HasSuffixString(name, "_opt")) {
        std::string* parameters =
            &plugin_parameters_[PluginName(plugin_prefix_, name)];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else {
        std::cerr << "Unknown flag: " << name << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
    } else {
      // It's an output flag.  Add it to the output directives.
      if (mode_ != MODE_COMPILE) {
        std::cerr << "Cannot use --encode, --decode or print .proto info and "
                     "generate code at the same time."
                  << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      OutputDirective directive;
      directive.name = name;
      if (generator_info == NULL) {
        directive.generator = NULL;
      } else {
        directive.generator = generator_info->generator;
      }

      // Split value at ':' to separate the generator parameter from the
      // filename.  However, avoid doing this if the colon is part of a valid
      // Windows-style absolute path.
      std::string::size_type colon_pos = value.find_first_of(':');
      if (colon_pos == std::string::npos || IsWindowsAbsolutePath(value)) {
        directive.output_location = value;
      } else {
        directive.parameter = value.substr(0, colon_pos);
        directive.output_location = value.substr(colon_pos + 1);
      }

      output_directives_.push_back(directive);
    }
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}